

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O0

void __thiscall libtorrent::aux::part_file::flush_metadata_impl(part_file *this,error_code *ec)

{
  char *__s;
  undefined8 code;
  bool bVar1;
  bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void> bVar2;
  int iVar3;
  uint uVar4;
  pointer ppVar5;
  char *pcVar6;
  error_code *in_R9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string_view lhs;
  span<const_char> buf;
  string_view rhs;
  handle_type local_e8 [2];
  ulong local_e0;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_d8;
  strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> local_cc;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  _Stack_c8;
  slot_index_t slot;
  iterator i;
  char *pcStack_b8;
  piece_index_t piece;
  char *ptr;
  undefined1 local_a8 [8];
  vector<char,_std::allocator<char>_> header;
  undefined1 local_7c [8];
  file_handle f;
  undefined1 local_38 [8];
  string p;
  error_code *ec_local;
  part_file *this_local;
  
  if ((this->m_dirty_metadata & 1U) != 0) {
    p.field_2._8_8_ = ec;
    bVar1 = ::std::
            unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
            ::empty(&this->m_piece_map);
    if (bVar1) {
      auVar7 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      lhs._M_len = auVar7._8_8_;
      auVar8 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_name);
      lhs._M_str = auVar8._0_8_;
      rhs._M_str = (char *)in_R9;
      rhs._M_len = auVar8._8_8_;
      combine_path_abi_cxx11_((string *)local_38,auVar7._0_8_,lhs,rhs);
      remove((libtorrent *)local_38,(char *)p.field_2._8_8_);
      code = p.field_2._8_8_;
      boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                ((error_condition *)(local_7c + 4),no_such_file_or_directory,(type *)0x0);
      bVar1 = boost::system::operator==((error_code *)code,(error_condition *)(local_7c + 4));
      if (bVar1) {
        boost::system::error_code::clear((error_code *)p.field_2._8_8_);
      }
      ::std::__cxx11::string::~string((string *)local_38);
    }
    else {
      bVar2 = libtorrent::flags::operator|
                        ((bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)0x1,
                         (bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)0x20);
      open_file((part_file *)local_7c,(open_mode_t)(uint)this,(error_code *)(ulong)bVar2.m_val);
      bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)p.field_2._8_8_);
      if (bVar1) {
        header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
      }
      else {
        iVar3 = this->m_header_size;
        ::std::allocator<char>::allocator();
        ::std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_a8,(long)iVar3,
                   (allocator_type *)((long)&ptr + 7));
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&ptr + 7));
        pcStack_b8 = ::std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)local_a8);
        write_uint32<int,char*>(this->m_max_pieces,&stack0xffffffffffffff48);
        write_uint32<int,char*>(this->m_piece_size,&stack0xffffffffffffff48);
        memset((void *)((long)&i.
                               super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                               ._M_cur + 4),0,4);
        while( true ) {
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                    ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&i,
                     this->m_max_pieces);
          bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                            ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                             ((long)&i.
                                     super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                     ._M_cur + 4),
                             (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&i);
          __s = pcStack_b8;
          if (!bVar1) break;
          _Stack_c8._M_cur =
               (__node_type *)
               ::std::
               unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
               ::find(&this->m_piece_map,
                      (key_type *)
                      ((long)&i.
                              super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                              ._M_cur + 4));
          local_d8._M_cur =
               (__node_type *)
               ::std::
               unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
               ::end(&this->m_piece_map);
          bVar1 = ::std::__detail::operator==(&stack0xffffffffffffff38,&local_d8);
          if (bVar1) {
            strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>::strong_typedef
                      (&local_cc,-1);
          }
          else {
            ppVar5 = ::std::__detail::
                     _Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                     ::operator->((_Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                                   *)&stack0xffffffffffffff38);
            local_cc.m_val = (ppVar5->second).m_val;
          }
          iVar3 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_cc);
          write_int32<int,char*>(iVar3,&stack0xffffffffffffff48);
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                    ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                     ((long)&i.
                             super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                             ._M_cur + 4));
        }
        iVar3 = this->m_header_size;
        pcVar6 = ::std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)local_a8);
        memset(__s,0,(size_t)(pcVar6 + ((long)iVar3 - (long)__s)));
        uVar4 = file_handle::fd((file_handle *)local_7c);
        span<char_const>::span<std::vector<char,std::allocator<char>>,char,void>
                  ((span<char_const> *)local_e8,(vector<char,_std::allocator<char>_> *)local_a8);
        buf.m_len = 0;
        buf.m_ptr = (char *)local_e0;
        pwrite_all((aux *)(ulong)uVar4,local_e8[0],buf,p.field_2._8_8_,in_R9);
        header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_ =
             boost::system::error_code::operator_cast_to_bool((error_code *)p.field_2._8_8_);
        if (!(bool)header.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_) {
          this->m_dirty_metadata = false;
        }
        header.super__Vector_base<char,_std::allocator<char>_>._M_impl._21_3_ = 0;
        ::std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_a8);
      }
      file_handle::~file_handle((file_handle *)local_7c);
    }
  }
  return;
}

Assistant:

void part_file::flush_metadata_impl(error_code& ec)
	{
		// do we need to flush the metadata?
		if (m_dirty_metadata == false) return;

		if (m_piece_map.empty())
		{
			// if we don't have any pieces left in the
			// part file, remove it
			std::string const p = combine_path(m_path, m_name);
			remove(p, ec);

			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();
			return;
		}

		auto f = open_file(aux::open_mode::write | aux::open_mode::hidden, ec);
		if (ec) return;

		std::vector<char> header(static_cast<std::size_t>(m_header_size));

		using namespace libtorrent::aux;

		char* ptr = header.data();
		write_uint32(m_max_pieces, ptr);
		write_uint32(m_piece_size, ptr);

		for (piece_index_t piece(0); piece < piece_index_t(m_max_pieces); ++piece)
		{
			auto const i = m_piece_map.find(piece);
			slot_index_t const slot(i == m_piece_map.end()
				? slot_index_t(-1) : i->second);
			write_int32(static_cast<int>(slot), ptr);
		}
		std::memset(ptr, 0, std::size_t(m_header_size - (ptr - header.data())));
		aux::pwrite_all(f.fd(), header, 0, ec);
		if (ec) return;
		m_dirty_metadata = false;
	}